

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool exists_dir(char *path)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char temp3 [260];
  stat sb;
  undefined8 uStack_1c0;
  char acStack_1b8 [272];
  stat local_a8;
  
  uStack_1c0 = 0x14081b;
  sVar3 = strlen(path);
  if (sVar3 == 0) {
    bVar1 = false;
  }
  else {
    if ((path[sVar3 - 1] == *G_BACKSLASH_CHAR) || (path[sVar3 - 1] == *G_FORWARD_SLASH_CHAR)) {
      uStack_1c0 = 0x140855;
      strcpy(acStack_1b8,path);
      uStack_1c0 = 0x14085d;
      pcVar4 = point_basename(acStack_1b8);
      if (*pcVar4 == '\0') {
        acStack_1b8[sVar3 - 1] = '\0';
        path = acStack_1b8;
      }
    }
    uStack_1c0 = 0x140879;
    normalize_forward_slash(path,acStack_1b8);
    uStack_1c0 = 0x14088c;
    iVar2 = stat(acStack_1b8,&local_a8);
    bVar1 = (local_a8.st_mode & 0xf000) == 0x4000 && iVar2 != -1;
  }
  return bVar1;
}

Assistant:

bool exists_dir(const char *path)
{
	size_t len = strlen(path);
	if (len == 0)
	{
		return false;
	}
	if ((path[len - 1] == *G_BACKSLASH_CHAR) || (path[len - 1] == *G_FORWARD_SLASH_CHAR))
	{
		char temp[MAX_PATH];
		strcpy(temp, path);
		char *base = point_basename(temp);
		if (*base == '\0')
		{
			temp[len - 1] = '\0';
			path = temp;
		}
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	char16_t temp2[MAX_PATH];
	if (u8tou16_path(path, temp2) == NULL)
	{
		return false;
	}
	if (PathFileExistsW(temp2) == false)
	{
		return false;
	}
	return PathIsDirectoryW(temp2);
#elif defined(__MINGW32__)
	char temp4[MAX_PATH];
	char *res = u8tosjis_path(path, temp4);
	if (res == NULL)
	{
		return false;
	}
	struct stat sb;
	if (stat(temp4, &sb) == -1)
	{
		return false;
	}
	if (S_ISDIR(sb.st_mode))
	{
		return true;
	}
	return false;
#else
	char temp3[MAX_PATH];
	normalize_forward_slash(path, temp3);
	struct stat sb;
	if (stat(temp3, &sb) == -1)
	{
		return false;
	}
	if (S_ISDIR(sb.st_mode))
	{
		return true;
	}
	return false;
#endif
}